

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::FlushFinishTests::init(FlushFinishTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  FlushFinishTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x90);
  Functional::anon_unknown_0::WaitOnlyCase::WaitOnlyCase
            ((WaitOnlyCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Functional::anon_unknown_0::FlushOnlyCase::FlushOnlyCase
            ((FlushOnlyCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Functional::anon_unknown_0::FlushWaitCase::FlushWaitCase
            ((FlushWaitCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Functional::anon_unknown_0::FinishOnlyCase::FinishOnlyCase
            ((FinishOnlyCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Functional::anon_unknown_0::FinishWaitCase::FinishWaitCase
            ((FinishWaitCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void FlushFinishTests::init (void)
{
	addChild(new WaitOnlyCase	(m_context));
	addChild(new FlushOnlyCase	(m_context));
	addChild(new FlushWaitCase	(m_context));
	addChild(new FinishOnlyCase	(m_context));
	addChild(new FinishWaitCase	(m_context));
}